

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_samtools.c
# Opt level: O2

int bam_construct_seq(bam_seq_t **bp,size_t extra_len,char *qname,size_t qname_len,int flag,
                     int rname,int pos,int end,int mapq,uint32_t ncigar,uint32_t *cigar,int mrnm,
                     int mpos,int isize,int len,char *seq,char *qual)

{
  bam_seq_t *pbVar1;
  byte bVar2;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint8_t *__s;
  long lVar8;
  size_t __n;
  int iVar9;
  int iVar10;
  undefined2 local_4c;
  
  pbVar1 = *bp;
  iVar10 = (int)(qname_len + 1);
  iVar9 = (int)extra_len + iVar10 + ncigar * 4 + len + (len + 1) / 2;
  if (pbVar1->m_data < iVar9) {
    uVar4 = (int)(iVar9 - 1U) >> 1 | iVar9 - 1U;
    uVar4 = (int)uVar4 >> 2 | uVar4;
    uVar4 = (int)uVar4 >> 4 | uVar4;
    uVar4 = (int)uVar4 >> 8 | uVar4;
    iVar5 = ((int)uVar4 >> 0x10 | uVar4) + 1;
    pbVar1->m_data = iVar5;
    puVar3 = (uint8_t *)realloc(pbVar1->data,(long)iVar5);
    pbVar1->data = puVar3;
    if (puVar3 == (uint8_t *)0x0) {
      return -1;
    }
  }
  __n = (size_t)len;
  pbVar1->l_data = iVar9;
  (pbVar1->core).tid = rname;
  (pbVar1->core).pos = pos + -1;
  iVar5 = 0x1249;
  bVar2 = 0xe;
  iVar9 = 0xc;
  do {
    if (iVar9 == -3) {
      uVar4 = 0;
LAB_0012b03f:
      local_4c = (undefined2)flag;
      *(ulong *)&(pbVar1->core).field_0x8 =
           (ulong)ncigar << 0x30 |
           (ulong)CONCAT24(local_4c,(mapq & 0xffU) << 0x10 | uVar4 | iVar10 << 0x18);
      (pbVar1->core).l_qseq = len;
      (pbVar1->core).mtid = mrnm;
      (pbVar1->core).mpos = mpos + -1;
      (pbVar1->core).isize = isize;
      puVar3 = pbVar1->data;
      strncpy((char *)puVar3,qname,qname_len);
      puVar3[qname_len] = '\0';
      memcpy(puVar3 + qname_len + 1,cigar,(ulong)(ncigar * 4));
      lVar7 = qname_len + ncigar * 4;
      lVar8 = 0;
      for (lVar6 = 0; lVar6 + 1 < (long)__n; lVar6 = lVar6 + 2) {
        puVar3[lVar8 + lVar7 + 1] =
             "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
             [(byte)seq[lVar8 * 2]] * '\x10' +
             "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
             [(byte)seq[lVar8 * 2 + 1]];
        lVar8 = lVar8 + 1;
      }
      __s = puVar3 + lVar8 + lVar7 + 1;
      if ((int)lVar6 < len) {
        *__s = "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
               [(byte)seq[lVar8 * 2]] << 4;
        __s = puVar3 + lVar8 + lVar7 + 2;
      }
      if (qual == (char *)0x0) {
        memset(__s,0xff,__n);
      }
      else {
        memcpy(__s,qual,__n);
      }
      return 0;
    }
    lVar8 = (long)pos >> (bVar2 & 0x3f);
    if (lVar8 == (long)end + -1 >> (bVar2 & 0x3f)) {
      uVar4 = iVar5 + (int)lVar8 & 0xffff;
      goto LAB_0012b03f;
    }
    bVar2 = bVar2 + 3;
    iVar5 = iVar5 + (-1 << ((byte)iVar9 & 0x1f));
    iVar9 = iVar9 + -3;
  } while( true );
}

Assistant:

int bam_construct_seq(bam_seq_t **bp, size_t extra_len,
		      const char *qname, size_t qname_len,
		      int flag,
		      int rname,      // Ref ID
		      int pos,
		      int end,        // aligned start/end coords
		      int mapq,
		      uint32_t ncigar, const uint32_t *cigar,
		      int mrnm,       // Mate Ref ID
		      int mpos,
		      int isize,
		      int len,
		      const char *seq,
		      const char *qual) {
    static const char L[256] = {
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15, 0,15,15,
	15, 1,14, 2,13,15,15, 4,11,15,15,12,15, 3,15,15,
	15,15, 5, 6, 8,15, 7, 9,15,10,15,15,15,15,15,15,
	15, 1,14, 2,13,15,15, 4,11,15,15,12,15, 3,15,15,
	15,15, 5, 6, 8,15, 7, 9,15,10,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15
    };
    bam1_t *b = (bam1_t *)*bp;
    uint8_t *cp;
    int i, bam_len;

    //b->l_aux = extra_len; // we fill this out later

    bam_len = qname_len + 1 + ncigar*4 + (len+1)/2 + len + extra_len;
    if (b->m_data < bam_len) {
	b->m_data = bam_len;
	kroundup32(b->m_data);
	b->data = (uint8_t*)realloc(b->data, b->m_data);
	if (!b->data)
	    return -1;
    }
    b->l_data = bam_len;

    b->core.tid     = rname;
    b->core.pos     = pos-1;
    b->core.bin     = bam_reg2bin(pos, end);
    b->core.qual    = mapq;
    b->core.l_qname = qname_len+1;
    b->core.flag    = flag;
    b->core.n_cigar = ncigar;
    b->core.l_qseq  = len;
    b->core.mtid    = mrnm;
    b->core.mpos    = mpos-1;
    b->core.isize   = isize;

    cp = b->data;

    strncpy((char *)cp, qname, qname_len);
    cp[qname_len] = 0;
    cp += qname_len+1;
    memcpy(cp, cigar, ncigar*4);
    cp += ncigar*4;

    for (i = 0; i+1 < len; i+=2) {
	*cp++ = (L[(uc)seq[i]]<<4) + L[(uc)seq[i+1]];
    }
    if (i < len)
	*cp++ = L[(uc)seq[i]]<<4;

    if (qual)
	memcpy(cp, qual, len);
    else
	memset(cp, '\xff', len);

    return 0;
}